

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_listoffer(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  MYSQL_RES *pMVar5;
  long lVar6;
  tm *__tp;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  char *pcVar8;
  string_view fmt;
  format_args args;
  undefined8 uVar9;
  long ttime;
  string buffer;
  undefined8 local_4928 [2];
  char *local_4918;
  char result [200];
  char buf [4608];
  char query [4608];
  char arg2 [4608];
  char arg1 [4608];
  
  bVar1 = str_cmp(argument,"auto");
  pcVar8 = "";
  pcVar7 = "AND status = 0";
  if (bVar1) {
    pcVar7 = "";
  }
  sprintf(query,"SELECT * FROM offerings WHERE deity = \"%s\" %s ORDER BY time ASC",ch->true_name,
          pcVar7);
  pMVar5 = one_query_res(query);
  if (bVar1) {
    pcVar7 = strstr(argument,"accept");
    if ((pcVar7 == (char *)0x0) && (pcVar7 = strstr(argument,"reject"), pcVar7 == (char *)0x0)) {
      bVar1 = is_number(argument);
      if (bVar1) {
        uVar3 = atoi(argument);
        iVar4 = 1;
        do {
          lVar6 = mysql_fetch_row(pMVar5);
          if (lVar6 == 0) {
            mysql_free_result(pMVar5);
            pcVar7 = "You have no offerings by that number.\n\r";
            goto LAB_00327687;
          }
          bVar1 = iVar4 < (int)uVar3;
          iVar4 = iVar4 + 1;
        } while (bVar1 || (int)uVar3 < 1);
        iVar4 = atoi(*(char **)(lVar6 + 0x20));
        ttime = atol(*(char **)(lVar6 + 0x28));
        __tp = localtime(&ttime);
        strftime(result,200,"%a %b %d, %l:%M%P",__tp);
        if (iVar4 == 0) {
          pcVar8 = "New";
        }
        else if (iVar4 == 1) {
          pcVar8 = "Rejected";
        }
        else if (iVar4 == 2) {
          pcVar8 = "Approved";
        }
        pcVar7 = buf;
        sprintf(pcVar7,
                "Offering %d:\n\rFrom: %s\n\rTime: %s\n\rStatus: %s\n\rOffering is %s (Vnum %s)\n\r"
                ,(ulong)uVar3,*(undefined8 *)(lVar6 + 0x18),result,pcVar8,
                *(undefined8 *)(lVar6 + 0x10),*(undefined8 *)(lVar6 + 8));
      }
      else {
        send_to_char("Offering listing:\n\r",ch);
        iVar4 = 1;
        bVar1 = false;
        while (lVar6 = mysql_fetch_row(pMVar5), lVar6 != 0) {
          iVar2 = atoi(*(char **)(lVar6 + 0x20));
          uVar9 = 0x4e;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              uVar9 = 0x52;
            }
            else {
              uVar9 = 0x41;
              if (iVar2 != 2) {
                uVar9 = 0x20;
              }
            }
          }
          sprintf(buf,"[%3i%c]  %s offered %s\n\r",iVar4,uVar9,*(undefined8 *)(lVar6 + 0x18),
                  *(undefined8 *)(lVar6 + 0x10));
          send_to_char(buf,ch);
          iVar4 = iVar4 + 1;
          bVar1 = true;
        }
        if (!bVar1) {
          send_to_char("There are currently no offerings to you.\n\r",ch);
        }
        pcVar7 = 
        "Use listoffer <number> to view an offering, and listoffer accept/reject <number> to accept it or not.\n\r"
        ;
      }
LAB_00327698:
      send_to_char(pcVar7,ch);
    }
    else {
      pcVar7 = one_argument(argument,arg1);
      one_argument(pcVar7,arg2);
      iVar2 = atoi(arg2);
      iVar4 = 1;
      do {
        lVar6 = mysql_fetch_row(pMVar5);
        if (lVar6 == 0) {
          pcVar7 = "That offering wasn\'t found.\n\r";
          goto LAB_00327698;
        }
        bVar1 = iVar4 < iVar2;
        iVar4 = iVar4 + 1;
      } while (bVar1 || iVar2 < 1);
      bVar1 = str_cmp(arg1,"reject");
      sprintf(query,"UPDATE offerings SET status=%i WHERE time=%s AND player=\'%s\'",
              (ulong)(bVar1 + 1),*(undefined8 *)(lVar6 + 0x28),*(undefined8 *)(lVar6 + 0x18));
      one_query(query);
      local_4928[0] = *(undefined8 *)(lVar6 + 0x18);
      fmt.size_ = 0xcc;
      fmt.data_ = (char *)0x1e;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_4928;
      local_4918 = arg1;
      ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"{}\'s offering has been {}ed.\n\r",fmt,args);
      send_to_char(buffer._M_dataplus._M_p,ch);
      std::__cxx11::string::~string((string *)&buffer);
    }
    mysql_free_result(pMVar5);
  }
  else {
    lVar6 = mysql_num_rows(pMVar5);
    mysql_free_result(pMVar5);
    if (lVar6 != 0) {
      pcVar7 = "You have unviewed offerings in your shrine.\n\r";
LAB_00327687:
      send_to_char(pcVar7,ch);
    }
  }
  return;
}

Assistant:

void do_listoffer(CHAR_DATA *ch, char *argument)
{
	MYSQL_RES *res_set;
	MYSQL_ROW row;
	char query[MSL], buf[MSL], result[200], arg1[MSL], arg2[MSL];
	bool autol= false, found= false;
	int status, i = 1, argnum;
	long ttime;

	if (!str_cmp(argument, "auto"))
		autol = true;

	sprintf(query, "SELECT * FROM offerings WHERE deity = \"%s\" %s ORDER BY time ASC",
		ch->true_name,
		autol ? "AND status = 0" : "");

	res_set = one_query_res(query);

	if (autol && !mysql_num_rows(res_set))
	{
		mysql_free_result(res_set);
		return;
	}
	else if (autol)
	{
		mysql_free_result(res_set);
		
		send_to_char("You have unviewed offerings in your shrine.\n\r", ch);		
		return;
	}

	if (strstr(argument, "accept") || strstr(argument, "reject"))
	{
		argument = one_argument(argument, arg1);
		argument = one_argument(argument, arg2);
		argnum = atoi(arg2);

		while ((row = mysql_fetch_row(res_set)))
		{
			if (i++ < argnum || argnum < 1)
				continue;

			if (!str_cmp(arg1, "reject"))
				status = 1;
			else
				status = 2;

			sprintf(query, "UPDATE offerings SET status=%i WHERE time=%s AND player='%s'", status, row[5], row[3]);
			one_query(query);

			auto buffer = fmt::format("{}'s offering has been {}ed.\n\r", row[3], arg1); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);

			found = true;
			break;
		}

		if (!found)
			send_to_char("That offering wasn't found.\n\r", ch);

		mysql_free_result(res_set);
		return;
	}

	if (is_number(argument))
	{
		argnum = atoi(argument);
		while ((row = mysql_fetch_row(res_set)))
		{
			if (i++ < argnum || argnum < 1)
				continue;

			status = atoi(row[4]);
			ttime = atol(row[5]);

			strftime(result, 200, "%a %b %d, %l:%M%P", localtime(&ttime));
			sprintf(buf, "Offering %d:\n\rFrom: %s\n\rTime: %s\n\rStatus: %s\n\rOffering is %s (Vnum %s)\n\r",
				argnum,
				row[3],
				result,
				status == 0 ? "New" : status == 1 ? "Rejected" : status == 2 ? "Approved" : "",
				row[2],
				row[1]);
			send_to_char(buf, ch);

			found = true;
			break;
		}

		mysql_free_result(res_set);

		if (!found)
			send_to_char("You have no offerings by that number.\n\r", ch);

		return;
	}

	send_to_char("Offering listing:\n\r", ch);

	while ((row = mysql_fetch_row(res_set)))
	{
		status = atoi(row[4]);
		sprintf(buf, "[%3i%c]  %s offered %s\n\r", i++, status == 0 ? 'N' : status == 1 ? 'R' : status == 2 ? 'A' : ' ', row[3], row[2]);
		send_to_char(buf, ch);
		found = true;
	}

	if (!found)
		send_to_char("There are currently no offerings to you.\n\r", ch);

	send_to_char("Use listoffer <number> to view an offering, and listoffer accept/reject <number> to accept it or not.\n\r", ch);
	mysql_free_result(res_set);
}